

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getShaderImageParamP_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TextureType imageType)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  TextureType imageType_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ivec2(1, 1)",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 - 1U < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ivec3(1, 1, 1)",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_14 == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageParamP (glu::TextureTestUtil::TextureType imageType)
{
	switch(imageType)
	{
		case glu::TextureTestUtil::TEXTURETYPE_2D:
			return "ivec2(1, 1)";

		case glu::TextureTestUtil::TEXTURETYPE_3D:
		case glu::TextureTestUtil::TEXTURETYPE_CUBE:
		case glu::TextureTestUtil::TEXTURETYPE_2D_ARRAY:
		case glu::TextureTestUtil::TEXTURETYPE_CUBE_ARRAY:
			return "ivec3(1, 1, 1)";

		case glu::TextureTestUtil::TEXTURETYPE_BUFFER:
			return "1";

		default:
			DE_ASSERT(false);
			return std::string("");
	}
}